

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegen.cpp
# Opt level: O1

void RegenerateCmakeAddSubdirectory(ostream *o,Component *comp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  reference pdVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  directory_iterator it;
  directory_iterator end;
  path p;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subdirs;
  directory_iterator local_b8;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  undefined1 *local_80;
  undefined1 local_70 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::filesystem::directory_iterator::directory_iterator(&local_b8,&comp->root,none);
  local_b0.px = (dir_itr_imp *)0x0;
  paVar1 = &local_a8.field_2;
  while( true ) {
    if ((local_b8.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_b0.px) ||
       (((local_b8.m_imp.px == (dir_itr_imp *)0x0 ||
         (*(long *)((long)local_b8.m_imp.px + 0x38) == 0)) &&
        ((local_b0.px == (dir_itr_imp *)0x0 || (*(long *)(local_b0.px + 0x38) == 0)))))) break;
    pdVar3 = boost::filesystem::directory_iterator::dereference(&local_b8);
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"CMakeLists.txt","");
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,*(long *)pdVar3,*(long *)(pdVar3 + 8) + *(long *)pdVar3);
    boost::filesystem::path::operator/=((path *)&local_a8,(path *)&local_80);
    boost::filesystem::detail::status((path *)local_88,(error_code *)&local_a8);
    uVar2 = local_88._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    if (uVar2 == 2) {
      boost::filesystem::directory_iterator::dereference(&local_b8);
      boost::filesystem::path::filename();
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_60,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
    boost::filesystem::detail::directory_iterator_increment(&local_b8,(error_code *)0x0);
  }
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      std::__ostream_insert<char,std::char_traits<char>>(o,"add_subdirectory(",0x11);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (o,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_b0);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_b8.m_imp);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void RegenerateCmakeAddSubdirectory(std::ostream& o,
                                    const Component& comp)
{
    // Temporary uses a set to sort subdirectories
    std::set<std::string> subdirs;
    filesystem::directory_iterator it(comp.root), end;
    for (; it != end; ++it) {
        if (filesystem::is_regular_file(it->path() / "CMakeLists.txt")) {
            subdirs.insert(it->path().filename().generic_string());
        }
    }
    for (auto subdir : subdirs) {
        o << "add_subdirectory(" << subdir << ")\n";
    }
        
}